

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qidentityproxymodel.cpp
# Opt level: O3

void __thiscall
QIdentityProxyModelPrivate::sourceLayoutChanged
          (QIdentityProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  bool bVar1;
  ulong uVar2;
  QModelIndex *pQVar3;
  long lVar4;
  long lVar5;
  QPersistentModelIndex *this_01;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  if ((this->proxyIndexes).d.size != 0) {
    lVar5 = 0;
    lVar4 = 0;
    uVar2 = 0;
    do {
      pQVar3 = (this->proxyIndexes).d.ptr;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)
                 ((long)&((this->layoutChangePersistentIndexes).d.ptr)->d + lVar4));
      (*this_00->_vptr_QObject[0x33])(&local_58,this_00,&local_78);
      QAbstractItemModel::changePersistentIndex
                ((QAbstractItemModel *)this_00,(QModelIndex *)((long)&pQVar3->r + lVar5),&local_58);
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 8;
      lVar5 = lVar5 + 0x18;
    } while (uVar2 < (ulong)(this->proxyIndexes).d.size);
  }
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  QList<QModelIndex>::clear(&this->proxyIndexes);
  local_58.r = 0;
  local_58.c = 0;
  local_58.i = 0;
  local_58.m.ptr = (QAbstractItemModel *)0x0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_58,(sourceParents->d).size);
  lVar4 = (sourceParents->d).size;
  if (lVar4 != 0) {
    this_01 = (sourceParents->d).ptr;
    lVar4 = lVar4 << 3;
    do {
      bVar1 = QPersistentModelIndex::isValid(this_01);
      if (bVar1) {
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
        (*this_00->_vptr_QObject[0x33])((QModelIndex *)&local_78,this_00,&local_90);
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_90,(QModelIndex *)&local_78);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_58,(qsizetype)local_58.m.ptr,
                   (QPersistentModelIndex *)&local_90);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_58);
        pQVar3 = &local_90;
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_58,(qsizetype)local_58.m.ptr,
                   (QPersistentModelIndex *)&local_78);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_58);
        pQVar3 = (QModelIndex *)&local_78;
      }
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)pQVar3);
      this_01 = this_01 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,(QList<QPersistentModelIndex> *)&local_58,hint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIdentityProxyModelPrivate::sourceLayoutChanged(
    const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QIdentityProxyModel);

    for (int i = 0; i < proxyIndexes.size(); ++i) {
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    }

    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();

    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }

    emit q->layoutChanged(parents, hint);
}